

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE_DEP_DPFSP.cpp
# Opt level: O0

void __thiscall
ADE_DEP_DPFSP::subCrossover(ADE_DEP_DPFSP *this,Permutazione *i1,Permutazione *i2,Permutazione *ris)

{
  undefined1 auVar1 [16];
  ushort uVar2;
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  undefined2 *puVar6;
  ushort local_44;
  ushort local_42;
  ushort local_40;
  unsigned_short lunghezzaSegmento;
  unsigned_short i_2;
  unsigned_short scostamento;
  unsigned_short k;
  unsigned_short i_1;
  unsigned_short f;
  unsigned_short i;
  unsigned_short *indiceTagli;
  bool *daEliminare;
  Permutazione *ris_local;
  Permutazione *i2_local;
  Permutazione *i1_local;
  ADE_DEP_DPFSP *this_local;
  
  pvVar4 = operator_new__((ulong)i1->dimensione);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)((uint)(this->istanza).fabbriche << 1);
  uVar5 = SUB168(auVar1 * ZEXT816(2),0);
  if (SUB168(auVar1 * ZEXT816(2),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  puVar6 = (undefined2 *)operator_new__(uVar5);
  for (scostamento = 0; scostamento < i1->dimensione; scostamento = scostamento + 1) {
    *(undefined1 *)((long)pvVar4 + (ulong)scostamento) = 0;
  }
  i_2 = 0;
  for (lunghezzaSegmento = 0; lunghezzaSegmento <= i1->dimensione;
      lunghezzaSegmento = lunghezzaSegmento + 1) {
    if (((this->istanza).lavori <= i1->individuo[lunghezzaSegmento]) ||
       (lunghezzaSegmento == i1->dimensione)) {
      if (i_2 == 0) {
        iVar3 = Random::randIntU(&genRand,0,(uint)lunghezzaSegmento);
        *puVar6 = (short)iVar3;
      }
      else {
        iVar3 = Random::randIntU(&genRand,(ushort)puVar6[(int)(i_2 - 1)] + 1,(uint)lunghezzaSegmento
                                );
        puVar6[i_2] = (short)iVar3;
      }
      puVar6[(int)(i_2 + 1)] = lunghezzaSegmento;
      for (local_40 = puVar6[i_2]; local_40 < (ushort)puVar6[(int)(i_2 + 1)];
          local_40 = local_40 + 1) {
        *(undefined1 *)((long)pvVar4 + (ulong)i1->individuo[local_40]) = 1;
      }
      i_2 = i_2 + 2;
    }
  }
  local_42 = 0;
  i_2 = 0;
  for (local_44 = 0; local_44 <= i2->dimensione; local_44 = local_44 + 1) {
    if ((i2->individuo[local_44] < (this->istanza).lavori) && (local_44 != i2->dimensione)) {
      if ((*(byte *)((long)pvVar4 + (ulong)i2->individuo[local_44]) & 1) == 0) {
        ris->individuo[local_42] = i2->individuo[local_44];
        local_42 = local_42 + 1;
      }
    }
    else {
      uVar2 = puVar6[(int)(i_2 + 1)] - puVar6[i_2];
      if (uVar2 != 0) {
        memcpy(ris->individuo + local_42,i1->individuo + (ushort)puVar6[i_2],(ulong)uVar2 << 1);
        local_42 = local_42 + uVar2;
      }
      if (local_44 != i2->dimensione) {
        ris->individuo[local_42] = i2->individuo[local_44];
        local_42 = local_42 + 1;
      }
      i_2 = i_2 + 2;
    }
  }
  if (pvVar4 != (void *)0x0) {
    operator_delete__(pvVar4);
  }
  if (puVar6 != (undefined2 *)0x0) {
    operator_delete__(puVar6);
  }
  return;
}

Assistant:

void ADE_DEP_DPFSP::subCrossover(Permutazione* i1, Permutazione* i2, Permutazione* ris) {

	bool* daEliminare = new bool[i1->dimensione];
	unsigned short* indiceTagli = new unsigned short[istanza.fabbriche * 2];

	for (unsigned short i = 0; i < i1->dimensione; i++) {
		daEliminare[i] = false; 
	}

	unsigned short f = 0;

	for (unsigned short i = 0; i <= i1->dimensione; i++) {

		if (i1->individuo[i] >= istanza.lavori || i == i1->dimensione) {

			if (f == 0) indiceTagli[0] = genRand.randIntU(0, i);
			else indiceTagli[f] = genRand.randIntU(indiceTagli[f - 1] + 1, i);

			indiceTagli[f + 1] = i;

			for (unsigned short k = indiceTagli[f]; k < indiceTagli[f + 1]; k++) {
				daEliminare[i1->individuo[k]] = true;
			}

			f += 2;
		}
	}

	unsigned short scostamento = 0;

	f = 0;

	for (unsigned short i = 0; i <= i2->dimensione; i++) {

		if (i2->individuo[i] >= istanza.lavori || i == i2->dimensione) {
			unsigned short lunghezzaSegmento = indiceTagli[f + 1] - indiceTagli[f];
			if (lunghezzaSegmento > 0) {
				memcpy(&(ris->individuo[scostamento]), &(i1->individuo[indiceTagli[f]]),
					lunghezzaSegmento*sizeof(unsigned short));
				scostamento += lunghezzaSegmento;
			}

			if(i != i2->dimensione) ris->individuo[scostamento++] = i2->individuo[i];

			f += 2;
		}
		else if (!daEliminare[i2->individuo[i]]) {
			ris->individuo[scostamento++] = i2->individuo[i];
		}
	}

	delete[] daEliminare;
	delete[] indiceTagli;
}